

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSymm.c
# Opt level: O1

void Abc_NtkSymmetries(Abc_Ntk_t *pNtk,int fUseBdds,int fNaive,int fReorder,int fVerbose)

{
  int iVar1;
  Abc_Obj_t *pObj;
  int *piVar2;
  DdNode *f;
  bool bVar3;
  int iVar4;
  uint uVar5;
  DdManager *unique;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  undefined8 uVar8;
  Extra_SymmInfo_t *p;
  char **ppcVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  size_t __size;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  timespec ts;
  uint local_94;
  timespec local_90;
  int local_80;
  int local_7c;
  Abc_Ntk_t *local_78;
  DdManager *local_70;
  int local_64;
  int local_60;
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  char **local_38;
  
  local_7c = fNaive;
  if (fUseBdds == 0 && fNaive == 0) {
    uVar5 = Sim_ComputeTwoVarSymms(pNtk,fVerbose);
    printf("The total number of symmetries is %d.\n",(ulong)uVar5);
    return;
  }
  local_80 = fVerbose;
  iVar4 = clock_gettime(3,&local_90);
  if (iVar4 < 0) {
    local_50 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    local_50 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  unique = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,10000000,1,fReorder,0,local_80);
  uVar5 = Abc_NtkSizeOfGlobalBdds(pNtk);
  printf("Shared BDD size = %d nodes.\n",(ulong)uVar5);
  Cudd_AutodynDisable(unique);
  local_70 = unique;
  Cudd_zddVarsFromBddVars(unique,2);
  iVar4 = clock_gettime(3,&local_90);
  if (iVar4 < 0) {
    local_48 = -1;
  }
  else {
    local_48 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
  }
  iVar4 = clock_gettime(3,&local_90);
  if (iVar4 < 0) {
    local_58 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_90.tv_nsec),8);
    local_58 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_90.tv_sec * -1000000;
  }
  pVVar6 = pNtk->vCos;
  local_64 = fReorder;
  if (pVVar6->nSize < 1) {
    local_94 = 0;
    uVar13 = 0;
  }
  else {
    lVar10 = 0;
    uVar13 = 0;
    local_94 = 0;
    local_78 = pNtk;
    do {
      local_5c = (int)uVar13;
      pObj = (Abc_Obj_t *)pVVar6->pArray[lVar10];
      pVVar6 = pObj->pNtk->vAttrs;
      local_40 = lVar10;
      if (pVVar6->nSize < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar2 = (int *)pVVar6->pArray[7];
      if (*(void **)(piVar2 + 2) == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar4 = pObj->Id;
      lVar10 = (long)iVar4;
      iVar1 = *piVar2;
      if (iVar1 <= iVar4) {
        iVar12 = iVar4 + 10;
        if (iVar4 < iVar1 * 2) {
          iVar12 = iVar1 * 2;
        }
        if (iVar1 < iVar12) {
          pvVar7 = realloc(*(void **)(piVar2 + 2),(long)iVar12 * 8);
          *(void **)(piVar2 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar2 * 8),0,((long)iVar12 - (long)*piVar2) * 8);
          *piVar2 = iVar12;
        }
      }
      if ((*(long *)(*(long *)(piVar2 + 2) + lVar10 * 8) == 0) &&
         (*(code **)(piVar2 + 8) != (code *)0x0)) {
        uVar8 = (**(code **)(piVar2 + 8))(*(undefined8 *)(piVar2 + 4));
        *(undefined8 *)(*(long *)(piVar2 + 2) + lVar10 * 8) = uVar8;
      }
      f = *(DdNode **)(*(long *)(piVar2 + 2) + lVar10 * 8);
      iVar4 = Cudd_SupportSize(local_70,f);
      pNtk = local_78;
      if (*(int *)((ulong)f & 0xfffffffffffffffe) != 0x7fffffff) {
        if (local_7c == 0) {
          p = Extra_SymmPairsCompute(local_70,f);
        }
        else {
          p = Extra_SymmPairsComputeNaive(local_70,f);
        }
        local_94 = local_94 + p->nSymms;
        if (local_80 != 0) {
          local_60 = iVar4;
          pcVar14 = Abc_ObjName(pObj);
          printf("Output %6s (%d): ",pcVar14,(ulong)(uint)p->nSymms);
          iVar4 = pNtk->vCis->nSize;
          ppcVar9 = Abc_NtkCollectCioNames(pNtk,0);
          __size = (long)iVar4 << 2;
          pvVar7 = malloc(__size);
          memset(pvVar7,0,__size);
          lVar10 = (long)p->nVars;
          if (0 < lVar10) {
            lVar15 = 0;
            local_38 = ppcVar9;
            do {
              if (*(int *)((long)pvVar7 + lVar15 * 4) == 0) {
                bVar3 = true;
                lVar16 = 0;
                do {
                  ppcVar9 = local_38;
                  if ((lVar15 != lVar16) && (p->pSymms[lVar15][lVar16] != '\0')) {
                    if (*(int *)((long)pvVar7 + lVar16 * 4) != 0) {
                      __assert_fail("pVarTaken[k] == 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSymm.c"
                                    ,0xd3,
                                    "void Ntk_NetworkSymmsPrint(Abc_Ntk_t *, Extra_SymmInfo_t *)");
                    }
                    if (bVar3) {
                      printf("  { %s",local_38[p->pVars[lVar15]]);
                      *(undefined4 *)((long)pvVar7 + lVar15 * 4) = 1;
                    }
                    bVar3 = false;
                    printf(" %s",ppcVar9[p->pVars[lVar16]]);
                    *(undefined4 *)((long)pvVar7 + lVar16 * 4) = 1;
                  }
                  ppcVar9 = local_38;
                  lVar16 = lVar16 + 1;
                } while (lVar10 != lVar16);
                if (!bVar3) {
                  printf(" }");
                }
              }
              lVar15 = lVar15 + 1;
            } while (lVar15 != lVar10);
          }
          putchar(10);
          if (ppcVar9 != (char **)0x0) {
            free(ppcVar9);
          }
          iVar4 = local_60;
          pNtk = local_78;
          if (pvVar7 != (void *)0x0) {
            free(pvVar7);
          }
        }
        Extra_SymmPairsDissolve(p);
      }
      uVar13 = (ulong)(uint)(local_5c + iVar4);
      lVar10 = local_40 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar10 < pVVar6->nSize);
  }
  printf("Total number of vars in functional supports = %8d.\n",uVar13);
  printf("Total number of two-variable symmetries     = %8d.\n",(ulong)local_94);
  iVar4 = clock_gettime(3,&local_90);
  if (iVar4 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_90.tv_nsec / 1000 + local_90.tv_sec * 1000000;
  }
  lVar10 = lVar10 + local_58;
  lVar15 = local_48 + local_50;
  Abc_NtkFreeGlobalBdds(pNtk,1);
  puts("Statistics of BDD-based symmetry detection:");
  pcVar14 = "naive";
  if (local_7c == 0) {
    pcVar14 = "fast";
  }
  pcVar11 = "no";
  if (local_64 != 0) {
    pcVar11 = "yes";
  }
  iVar4 = 0x985b9c;
  printf("Algorithm = %s. Reordering = %s. Garbage collection = %s.\n",pcVar14,pcVar11);
  Abc_Print(iVar4,"%s =","Constructing BDDs");
  Abc_Print(iVar4,"%9.2f sec\n",(double)lVar15 / 1000000.0);
  Abc_Print(iVar4,"%s =","Computing symms  ");
  Abc_Print(iVar4,"%9.2f sec\n",(double)lVar10 / 1000000.0);
  Abc_Print(iVar4,"%s =","TOTAL            ");
  Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar15 + lVar10) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkSymmetries( Abc_Ntk_t * pNtk, int fUseBdds, int fNaive, int fReorder, int fVerbose )
{
    if ( fUseBdds || fNaive )
        Abc_NtkSymmetriesUsingBdds( pNtk, fNaive, fReorder, fVerbose );
    else
        Abc_NtkSymmetriesUsingSandS( pNtk, fVerbose );
}